

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

Node * hashkey(GCtab *t,cTValue *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (key->field_2).it;
  if (uVar1 == 0xfffffffb) {
    uVar1 = t->hmask & *(uint *)((ulong)(key->u32).lo + 8);
  }
  else {
    if (uVar1 < 0xfffeffff) {
      uVar3 = uVar1 * 2;
      uVar2 = ((key->u32).lo ^ uVar3) - (uVar1 << 0xf | uVar3 >> 0x12);
      uVar1 = ((uVar1 << 0x14 | uVar3 >> 0xd) ^ uVar2) - (uVar2 * 0x2000 | uVar2 >> 0x13);
    }
    else {
      if (uVar1 + 3 < 2) {
        uVar1 = -uVar1 - 2 & t->hmask;
        goto LAB_0010b8ee;
      }
      uVar1 = (key->u32).lo + 0xfb3ee249;
      uVar3 = ((key->u32).lo ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
      uVar1 = ((uVar1 * 0x80000 | uVar1 >> 0xd) ^ uVar3) - (uVar3 * 0x2000 | uVar3 >> 0x13);
    }
    uVar1 = uVar1 & t->hmask;
  }
LAB_0010b8ee:
  return (Node *)((ulong)(t->node).ptr32 + (ulong)uVar1 * 0x18);
}

Assistant:

static Node *hashkey(const GCtab *t, cTValue *key)
{
  lua_assert(!tvisint(key));
  if (tvisstr(key))
    return hashstr(t, strV(key));
  else if (tvisnum(key))
    return hashnum(t, key);
  else if (tvisbool(key))
    return hashmask(t, boolV(key));
  else
    return hashgcref(t, key->gcr);
  /* Only hash 32 bits of lightuserdata on a 64 bit CPU. Good enough? */
}